

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O1

bool do_test<bool>(Boxed_Value *bv,bool T,bool ConstT,bool TRef,bool ConstTRef,bool TPtr,
                  bool ConstTPtr,bool TPtrConst,bool ConstTPtrConst,bool SharedPtrT,
                  bool SharedConstPtrT,bool SharedPtrTRef,bool ConstSharedPtrT,
                  bool ConstSharedConstPtrT,bool ConstSharedPtrTRef,bool ConstSharedPtrTConstRef,
                  bool WrappedRef,bool WrappedConstRef,bool ConstWrappedRef,
                  bool ConstWrappedConstRef,bool ConstWrappedRefRef,bool ConstWrappedConstRefRef,
                  bool Number,bool ConstNumber,bool ConstNumberRef,bool TPtrConstRef,
                  bool ConstTPtrConstRef)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  
  bVar1 = test_type_conversion<bool>(bv,T);
  bVar2 = test_type_conversion<bool_const>(bv,ConstT);
  bVar3 = test_type_conversion<bool&>(bv,TRef);
  bVar4 = test_type_conversion<bool_const&>(bv,ConstTRef);
  bVar5 = test_type_conversion<bool*>(bv,TPtr);
  bVar6 = test_type_conversion<bool_const*>(bv,ConstTPtr);
  bVar7 = test_type_conversion<bool*const>(bv,TPtrConst);
  bVar8 = test_type_conversion<bool_const*const>(bv,ConstTPtrConst);
  bVar9 = test_type_conversion<std::shared_ptr<bool>>(bv,SharedPtrT);
  bVar10 = test_type_conversion<std::shared_ptr<bool_const>>(bv,SharedConstPtrT);
  bVar11 = test_type_conversion<std::shared_ptr<bool>&>(bv,SharedPtrTRef);
  bVar12 = test_type_conversion<std::shared_ptr<bool>const>(bv,ConstSharedPtrT);
  bVar13 = test_type_conversion<std::shared_ptr<bool_const>const>(bv,ConstSharedConstPtrT);
  bVar14 = test_type_conversion<std::shared_ptr<bool>const&>(bv,ConstSharedPtrTRef);
  bVar15 = test_type_conversion<std::shared_ptr<bool_const>const&>(bv,ConstSharedPtrTConstRef);
  bVar16 = test_type_conversion<std::reference_wrapper<bool>>(bv,WrappedRef);
  bVar17 = test_type_conversion<std::reference_wrapper<bool_const>>(bv,WrappedConstRef);
  bVar18 = test_type_conversion<std::reference_wrapper<bool>&>(bv,false);
  bVar19 = test_type_conversion<std::reference_wrapper<bool_const>&>(bv,false);
  bVar20 = test_type_conversion<std::reference_wrapper<bool>const>(bv,ConstWrappedRef);
  bVar21 = test_type_conversion<std::reference_wrapper<bool_const>const>(bv,ConstWrappedConstRef);
  bVar22 = test_type_conversion<std::reference_wrapper<bool>const&>(bv,ConstWrappedRefRef);
  bVar23 = test_type_conversion<std::reference_wrapper<bool_const>const&>
                     (bv,ConstWrappedConstRefRef);
  bVar24 = test_type_conversion<chaiscript::Boxed_Number>(bv,Number);
  bVar25 = test_type_conversion<chaiscript::Boxed_Number_const>(bv,ConstNumber);
  bVar26 = test_type_conversion<chaiscript::Boxed_Number&>(bv,false);
  bVar27 = test_type_conversion<chaiscript::Boxed_Number_const&>(bv,ConstNumberRef);
  bVar28 = test_type_conversion<chaiscript::Boxed_Number*>(bv,false);
  bVar29 = test_type_conversion<chaiscript::Boxed_Number_const*>(bv,false);
  bVar30 = test_type_conversion<chaiscript::Boxed_Number*const>(bv,false);
  bVar31 = test_type_conversion<chaiscript::Boxed_Number_const*const>(bv,false);
  bVar32 = test_type_conversion<bool*&>(bv,false);
  bVar33 = test_type_conversion<bool_const*&>(bv,false);
  bVar34 = test_type_conversion<bool*const&>(bv,TPtrConstRef);
  bVar35 = test_type_conversion<bool_const*const&>(bv,ConstTPtrConstRef);
  bVar36 = test_type_conversion<chaiscript::Boxed_Value>(bv,true);
  bVar37 = test_type_conversion<chaiscript::Boxed_Value_const>(bv,true);
  bVar38 = test_type_conversion<chaiscript::Boxed_Value_const&>(bv,true);
  return (bVar38 && (bVar37 && (bVar36 && (bVar35 && bVar34)))) &&
         ((bVar33 && (bVar32 && (bVar31 && (bVar30 && (bVar29 && (bVar28 && bVar27)))))) &&
         ((bVar26 && (bVar25 && (bVar24 && (bVar23 && (bVar22 && bVar21))))) &&
         ((bVar20 && (bVar19 && (bVar18 && (bVar17 && bVar16)))) &&
         ((bVar15 && (bVar14 && (bVar13 && bVar12))) &&
         ((bVar11 && (bVar10 && bVar9)) &&
         ((bVar8 && bVar7) && (bVar6 && (bVar5 && ((bVar4 && bVar3) && (bVar2 && bVar1))))))))));
}

Assistant:

bool do_test(const Boxed_Value &bv,
             bool T,
             bool ConstT,
             bool TRef,
             bool ConstTRef,
             bool TPtr,
             bool ConstTPtr,
             bool TPtrConst,
             bool ConstTPtrConst,
             bool SharedPtrT,
             bool SharedConstPtrT,
             bool SharedPtrTRef,
             bool ConstSharedPtrT,
             bool ConstSharedConstPtrT,
             bool ConstSharedPtrTRef,
             bool ConstSharedPtrTConstRef,
             bool WrappedRef,
             bool WrappedConstRef,
             bool ConstWrappedRef,
             bool ConstWrappedConstRef,
             bool ConstWrappedRefRef,
             bool ConstWrappedConstRefRef,
             bool Number,
             bool ConstNumber,
             bool ConstNumberRef,
             bool TPtrConstRef,
             bool ConstTPtrConstRef) {
  bool passed = true;
  passed &= test_type_conversion<Type>(bv, T);
  passed &= test_type_conversion<const Type>(bv, ConstT);
  passed &= test_type_conversion<Type &>(bv, TRef);
  passed &= test_type_conversion<const Type &>(bv, ConstTRef);
  passed &= test_type_conversion<Type *>(bv, TPtr);
  passed &= test_type_conversion<const Type *>(bv, ConstTPtr);
  passed &= test_type_conversion<Type *const>(bv, TPtrConst);
  passed &= test_type_conversion<const Type *const>(bv, ConstTPtrConst);
  passed &= test_type_conversion<std::shared_ptr<Type>>(bv, SharedPtrT);
  passed &= test_type_conversion<std::shared_ptr<const Type>>(bv, SharedConstPtrT);
  passed &= test_type_conversion<std::shared_ptr<Type> &>(bv, SharedPtrTRef);
  // passed &= test_type_conversion<std::shared_ptr<const Type> &>(bv, false);
  passed &= test_type_conversion<const std::shared_ptr<Type>>(bv, ConstSharedPtrT);
  passed &= test_type_conversion<const std::shared_ptr<const Type>>(bv, ConstSharedConstPtrT);
  passed &= test_type_conversion<const std::shared_ptr<Type> &>(bv, ConstSharedPtrTRef);
  passed &= test_type_conversion<const std::shared_ptr<const Type> &>(bv, ConstSharedPtrTConstRef);
  passed &= test_type_conversion<std::reference_wrapper<Type>>(bv, WrappedRef);
  passed &= test_type_conversion<std::reference_wrapper<const Type>>(bv, WrappedConstRef);
  passed &= test_type_conversion<std::reference_wrapper<Type> &>(bv, false);
  passed &= test_type_conversion<std::reference_wrapper<const Type> &>(bv, false);
  passed &= test_type_conversion<const std::reference_wrapper<Type>>(bv, ConstWrappedRef);
  passed &= test_type_conversion<const std::reference_wrapper<const Type>>(bv, ConstWrappedConstRef);
  passed &= test_type_conversion<const std::reference_wrapper<Type> &>(bv, ConstWrappedRefRef);
  passed &= test_type_conversion<const std::reference_wrapper<const Type> &>(bv, ConstWrappedConstRefRef);
  passed &= test_type_conversion<Boxed_Number>(bv, Number);
  passed &= test_type_conversion<const Boxed_Number>(bv, ConstNumber);
  passed &= test_type_conversion<Boxed_Number &>(bv, false);
  passed &= test_type_conversion<const Boxed_Number &>(bv, ConstNumberRef);
  passed &= test_type_conversion<Boxed_Number *>(bv, false);
  passed &= test_type_conversion<const Boxed_Number *>(bv, false);
  passed &= test_type_conversion<Boxed_Number *const>(bv, false);
  passed &= test_type_conversion<const Boxed_Number *const>(bv, false);
  passed &= test_type_conversion<Type *&>(bv, false);
  passed &= test_type_conversion<const Type *&>(bv, false);
  passed &= test_type_conversion<Type *const &>(bv, TPtrConstRef);
  passed &= test_type_conversion<const Type *const &>(bv, ConstTPtrConstRef);
  passed &= test_type_conversion<Boxed_Value>(bv, true);
  passed &= test_type_conversion<const Boxed_Value>(bv, true);
  passed &= test_type_conversion<const Boxed_Value &>(bv, true);

  return passed;
}